

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool art_iterator_lower_bound(art_iterator_t *iterator,art_key_chunk_t *key)

{
  int iVar1;
  art_ref_t aVar2;
  art_iterator_t *in_RDI;
  art_iterator_t *unaff_retaddr;
  art_inner_node_t *inner_node;
  int compare_result;
  art_ref_t root;
  undefined6 in_stack_ffffffffffffffc8;
  uint8_t in_stack_ffffffffffffffce;
  uint8_t in_stack_ffffffffffffffcf;
  art_iterator_t *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffdc;
  art_key_chunk_t *in_stack_ffffffffffffffe0;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  _Bool _Var3;
  
  if (in_RDI->value == (art_val_t *)0x0) {
    in_RDI->frame = '\0';
    in_RDI->depth = '\0';
    aVar2 = art_iterator_ref(in_RDI);
    if (aVar2 == 0) {
      _Var3 = false;
    }
    else {
      _Var3 = art_node_iterator_lower_bound
                        ((art_ref_t)inner_node,unaff_retaddr,
                         (art_key_chunk_t *)
                         CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    }
  }
  else {
    for (iVar1 = art_compare_prefix(in_stack_ffffffffffffffe0,
                                    (uint8_t)((uint)in_stack_ffffffffffffffdc >> 0x18),
                                    in_stack_ffffffffffffffd0->key,in_stack_ffffffffffffffcf,
                                    in_stack_ffffffffffffffce); iVar1 != 0;
        iVar1 = art_compare_prefix(in_stack_ffffffffffffffe0,(uint8_t)((uint)iVar1 >> 0x18),
                                   (art_key_chunk_t *)in_stack_ffffffffffffffd0,
                                   in_stack_ffffffffffffffcf,in_stack_ffffffffffffffce)) {
      _Var3 = art_iterator_up((art_iterator_t *)
                              CONCAT17(in_stack_ffffffffffffffcf,
                                       CONCAT16(in_stack_ffffffffffffffce,in_stack_ffffffffffffffc8)
                                      ));
      if (!_Var3) {
        if (iVar1 < 0) {
          _Var3 = art_iterator_invalid_loc((art_iterator_t *)0x10c513);
          return _Var3;
        }
        art_iterator_ref(in_RDI);
        _Var3 = art_node_init_iterator((art_ref_t)key,(art_iterator_t *)root,compare_result._3_1_);
        return _Var3;
      }
      in_stack_ffffffffffffffd0 = (art_iterator_t *)art_iterator_node(in_stack_ffffffffffffffd0);
    }
    art_iterator_ref(in_RDI);
    _Var3 = art_node_iterator_lower_bound
                      ((art_ref_t)inner_node,unaff_retaddr,
                       (art_key_chunk_t *)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  }
  return _Var3;
}

Assistant:

bool art_iterator_lower_bound(art_iterator_t *iterator,
                              const art_key_chunk_t *key) {
    if (iterator->value == NULL) {
        // We're beyond the end / start of the ART so the iterator does not
        // have a valid key. Start from the root.
        iterator->frame = 0;
        iterator->depth = 0;
        art_ref_t root = art_iterator_ref(iterator);
        if (root == CROARING_ART_NULL_REF) {
            return false;
        }
        return art_node_iterator_lower_bound(root, iterator, key);
    }
    int compare_result =
        art_compare_prefix(iterator->key, 0, key, 0, ART_KEY_BYTES);
    // Move up until we have an equal prefix, after which we can do a normal
    // lower bound search.
    while (compare_result != 0) {
        if (!art_iterator_up(iterator)) {
            if (compare_result < 0) {
                // Only smaller keys found.
                return art_iterator_invalid_loc(iterator);
            } else {
                return art_node_init_iterator(art_iterator_ref(iterator),
                                              iterator, true);
            }
        }
        // Since we're only moving up, we can keep comparing against the
        // iterator key.
        art_inner_node_t *inner_node =
            (art_inner_node_t *)art_iterator_node(iterator);
        compare_result =
            art_compare_prefix(iterator->key, 0, key, 0,
                               iterator->depth + inner_node->prefix_size);
    }
    if (compare_result > 0) {
        return art_node_init_iterator(art_iterator_ref(iterator), iterator,
                                      true);
    }
    return art_node_iterator_lower_bound(art_iterator_ref(iterator), iterator,
                                         key);
}